

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O2

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t *self)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    if (self->hashmsk < uVar1) {
      return (cf_hashtbl_iter_t)0x0;
    }
    uVar2 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
  } while (self->table[uVar2] == (cf_hashtbl_iter_t)0x0);
  return self->table[uVar2];
}

Assistant:

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t* self) {
    cf_uint32_t i;
    /* find the first table index */
    for (i = 0; i <= self->hashmsk; i++) {
        if (self->table[i]) {
            return self->table[i];
        }
    }
    return CF_NULL_PTR;
}